

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

uint64_t address_space_ldq_be_arm
                   (uc_struct_conflict1 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  ulong uVar1;
  MemTxResult MVar2;
  MemoryRegion *mr;
  ulong *puVar3;
  hwaddr addr1;
  uint64_t val;
  hwaddr l;
  ram_addr_t local_38;
  ulong local_30;
  hwaddr local_28;
  
  local_28 = 8;
  mr = flatview_translate_arm(uc,as->current_map,addr,&local_38,&local_28,false,attrs);
  if ((local_28 < 8) || (mr->ram == false)) {
    MVar2 = memory_region_dispatch_read_arm(uc,mr,local_38,&local_30,MO_BEQ,attrs);
  }
  else {
    puVar3 = (ulong *)qemu_map_ram_ptr_arm((uc_struct_conflict1 *)mr->uc,mr->ram_block,local_38);
    uVar1 = *puVar3;
    local_30 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
    MVar2 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar2;
  }
  return local_30;
}

Assistant:

uint64_t glue(address_space_ldq_be, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_ldq_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                    DEVICE_BIG_ENDIAN);
}